

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_decl.cc
# Opt level: O3

void __thiscall Decl::~Decl(Decl *this)

{
  ID *this_00;
  AttrList *pAVar1;
  pointer ppAVar2;
  
  this->_vptr_Decl = (_func_int **)&PTR__Decl_00144a68;
  this_00 = this->id_;
  if (this_00 != (ID *)0x0) {
    ID::~ID(this_00);
  }
  operator_delete(this_00,0x78);
  pAVar1 = this->attrlist_;
  if (pAVar1 == (AttrList *)0x0) {
    pAVar1 = (AttrList *)0x0;
  }
  else {
    ppAVar2 = (pAVar1->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppAVar2 !=
        (pAVar1->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (*ppAVar2 != (Attr *)0x0) {
          (*((*ppAVar2)->super_DataDepElement)._vptr_DataDepElement[1])();
          pAVar1 = this->attrlist_;
        }
        ppAVar2 = ppAVar2 + 1;
      } while (ppAVar2 !=
               (pAVar1->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
      ppAVar2 = (pAVar1->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (ppAVar2 != (pointer)0x0) {
      operator_delete(ppAVar2,(long)(pAVar1->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar2);
    }
  }
  operator_delete(pAVar1,0x18);
  this->attrlist_ = (AttrList *)0x0;
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Decl::~Decl()
	{
	delete id_;
	delete_list(AttrList, attrlist_);
	}